

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_int_eq(int a,int b,char *testcase,int line)

{
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  uint in_EDI;
  int err;
  
  test_counter = test_counter + 1;
  if ((in_EDI != in_ESI) == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
    printf("# Expected %d, but observed %d instead (line %d)\n",(ulong)in_EDI,(ulong)in_ESI,
           (ulong)in_ECX);
    global_err = global_err + 1;
  }
  return (uint)(in_EDI != in_ESI);
}

Assistant:

int assert_int_eq(int a, int b, const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %d, but observed %d instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}